

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt * __thiscall llvm::APInt::operator+=(APInt *this,APInt *RHS)

{
  uint uVar1;
  APInt *pAVar2;
  
  uVar1 = this->BitWidth;
  if (uVar1 == RHS->BitWidth) {
    if (uVar1 < 0x41) {
      (this->U).pVal = (uint64_t *)((long)(this->U).pVal + (long)(RHS->U).pVal);
    }
    else {
      tcAdd((this->U).pVal,(RHS->U).pVal,0,(uint)((ulong)uVar1 + 0x3f >> 6));
    }
    pAVar2 = clearUnusedBits(this);
    return pAVar2;
  }
  __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0xc1,"APInt &llvm::APInt::operator+=(const APInt &)");
}

Assistant:

APInt& APInt::operator+=(const APInt& RHS) {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");
  if (isSingleWord())
    U.VAL += RHS.U.VAL;
  else
    tcAdd(U.pVal, RHS.U.pVal, 0, getNumWords());
  return clearUnusedBits();
}